

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeTable(HuffmanTree *tree)

{
  byte bVar1;
  ushort uVar2;
  char cVar3;
  byte bVar4;
  undefined1 uVar5;
  uint uVar6;
  uint uVar7;
  void *dst;
  void *pvVar8;
  long *in_RDI;
  uint index2;
  uint reverse2;
  uint j_1;
  uint num_1;
  uint start;
  uint tablelen;
  uint maxlen;
  uint index_2;
  uint index_1;
  uint j;
  uint num;
  uint reverse;
  uint symbol_1;
  uint l_3;
  uint l_2;
  uint l_1;
  uint index;
  uint l;
  uint symbol;
  uint *maxlens;
  size_t size;
  size_t pointer;
  size_t numpresent;
  size_t i;
  uint local_88;
  uint local_7c;
  uint local_60;
  ulong local_30;
  long local_28;
  ulong local_20;
  ulong local_18;
  uint local_4;
  
  dst = lodepng_malloc(0x357139);
  if (dst == (void *)0x0) {
    local_4 = 0x53;
  }
  else {
    lodepng_memset(dst,0,0x800);
    for (local_18 = 0; local_18 < *(uint *)((long)in_RDI + 0x14); local_18 = local_18 + 1) {
      local_88 = *(uint *)(in_RDI[1] + local_18 * 4);
      if (9 < local_88) {
        uVar6 = reverseBits(*(uint *)(*in_RDI + local_18 * 4) >> ((char)local_88 - 9U & 0x1f),9);
        if (local_88 < *(uint *)((long)dst + (ulong)uVar6 * 4)) {
          local_88 = *(uint *)((long)dst + (ulong)uVar6 * 4);
        }
        *(uint *)((long)dst + (ulong)uVar6 * 4) = local_88;
      }
    }
    local_30 = 0x200;
    for (local_18 = 0; local_18 < 0x200; local_18 = local_18 + 1) {
      uVar6 = *(uint *)((long)dst + local_18 * 4);
      if (9 < uVar6) {
        local_30 = (1L << ((char)uVar6 - 9U & 0x3f)) + local_30;
      }
    }
    pvVar8 = lodepng_malloc(0x3572be);
    in_RDI[3] = (long)pvVar8;
    pvVar8 = lodepng_malloc(0x3572da);
    in_RDI[4] = (long)pvVar8;
    if ((in_RDI[3] == 0) || (in_RDI[4] == 0)) {
      lodepng_free((void *)0x357311);
      local_4 = 0x53;
    }
    else {
      for (local_18 = 0; local_18 < local_30; local_18 = local_18 + 1) {
        *(undefined1 *)(in_RDI[3] + local_18) = 0x10;
      }
      local_28 = 0x200;
      for (local_18 = 0; local_18 < 0x200; local_18 = local_18 + 1) {
        uVar6 = *(uint *)((long)dst + local_18 * 4);
        if (9 < uVar6) {
          cVar3 = (char)uVar6;
          *(char *)(in_RDI[3] + local_18) = cVar3;
          *(short *)(in_RDI[4] + local_18 * 2) = (short)local_28;
          local_28 = (1L << (cVar3 - 9U & 0x3f)) + local_28;
        }
      }
      lodepng_free((void *)0x35742b);
      local_20 = 0;
      for (local_18 = 0; local_18 < *(uint *)((long)in_RDI + 0x14); local_18 = local_18 + 1) {
        uVar6 = *(uint *)(in_RDI[1] + local_18 * 4);
        if (uVar6 != 0) {
          uVar7 = reverseBits(*(uint *)(*in_RDI + local_18 * 4),uVar6);
          local_20 = local_20 + 1;
          bVar4 = (byte)uVar6;
          if (uVar6 < 10) {
            for (local_60 = 0; local_60 < (uint)(1 << (9 - bVar4 & 0x1f)); local_60 = local_60 + 1)
            {
              uVar6 = uVar7 | local_60 << (bVar4 & 0x1f);
              if (*(char *)(in_RDI[3] + (ulong)uVar6) != '\x10') {
                return 0x37;
              }
              *(byte *)(in_RDI[3] + (ulong)uVar6) = bVar4;
              *(short *)(in_RDI[4] + (ulong)uVar6 * 2) = (short)local_18;
            }
          }
          else {
            bVar1 = *(byte *)(in_RDI[3] + (ulong)(uVar7 & 0x1ff));
            uVar2 = *(ushort *)(in_RDI[4] + (ulong)(uVar7 & 0x1ff) * 2);
            if (bVar1 < uVar6) {
              return 0x37;
            }
            for (local_7c = 0; local_7c < (uint)(1 << ((bVar1 - 9) - (bVar4 - 9) & 0x1f));
                local_7c = local_7c + 1) {
              uVar6 = (uint)uVar2 + (uVar7 >> 9 | local_7c << (bVar4 - 9 & 0x1f));
              *(byte *)(in_RDI[3] + (ulong)uVar6) = bVar4;
              *(short *)(in_RDI[4] + (ulong)uVar6 * 2) = (short)local_18;
            }
          }
        }
      }
      if (local_20 < 2) {
        for (local_18 = 0; local_18 < local_30; local_18 = local_18 + 1) {
          if (*(char *)(in_RDI[3] + local_18) == '\x10') {
            uVar5 = 10;
            if (local_18 < 0x200) {
              uVar5 = 1;
            }
            *(undefined1 *)(in_RDI[3] + local_18) = uVar5;
            *(undefined2 *)(in_RDI[4] + local_18 * 2) = 0xffff;
          }
        }
      }
      else {
        for (local_18 = 0; local_18 < local_30; local_18 = local_18 + 1) {
          if (*(char *)(in_RDI[3] + local_18) == '\x10') {
            return 0x37;
          }
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static unsigned HuffmanTree_makeTable(HuffmanTree* tree) {
  static const unsigned headsize = 1u << FIRSTBITS; /*size of the first table*/
  static const unsigned mask = (1u << FIRSTBITS) /*headsize*/ - 1u;
  size_t i, numpresent, pointer, size; /*total table size*/
  unsigned* maxlens = (unsigned*)lodepng_malloc(headsize * sizeof(unsigned));
  if(!maxlens) return 83; /*alloc fail*/

  /* compute maxlens: max total bit length of symbols sharing prefix in the first table*/
  lodepng_memset(maxlens, 0, headsize * sizeof(*maxlens));
  for(i = 0; i < tree->numcodes; i++) {
    unsigned symbol = tree->codes[i];
    unsigned l = tree->lengths[i];
    unsigned index;
    if(l <= FIRSTBITS) continue; /*symbols that fit in first table don't increase secondary table size*/
    /*get the FIRSTBITS MSBs, the MSBs of the symbol are encoded first. See later comment about the reversing*/
    index = reverseBits(symbol >> (l - FIRSTBITS), FIRSTBITS);
    maxlens[index] = LODEPNG_MAX(maxlens[index], l);
  }
  /* compute total table size: size of first table plus all secondary tables for symbols longer than FIRSTBITS */
  size = headsize;
  for(i = 0; i < headsize; ++i) {
    unsigned l = maxlens[i];
    if(l > FIRSTBITS) size += (((size_t)1) << (l - FIRSTBITS));
  }
  tree->table_len = (unsigned char*)lodepng_malloc(size * sizeof(*tree->table_len));
  tree->table_value = (unsigned short*)lodepng_malloc(size * sizeof(*tree->table_value));
  if(!tree->table_len || !tree->table_value) {
    lodepng_free(maxlens);
    /* freeing tree->table values is done at a higher scope */
    return 83; /*alloc fail*/
  }
  /*initialize with an invalid length to indicate unused entries*/
  for(i = 0; i < size; ++i) tree->table_len[i] = 16;

  /*fill in the first table for long symbols: max prefix size and pointer to secondary tables*/
  pointer = headsize;
  for(i = 0; i < headsize; ++i) {
    unsigned l = maxlens[i];
    if(l <= FIRSTBITS) continue;
    tree->table_len[i] = l;
    tree->table_value[i] = (unsigned short)pointer;
    pointer += (((size_t)1) << (l - FIRSTBITS));
  }
  lodepng_free(maxlens);

  /*fill in the first table for short symbols, or secondary table for long symbols*/
  numpresent = 0;
  for(i = 0; i < tree->numcodes; ++i) {
    unsigned l = tree->lengths[i];
    unsigned symbol, reverse;
    if(l == 0) continue;
    symbol = tree->codes[i]; /*the huffman bit pattern. i itself is the value.*/
    /*reverse bits, because the huffman bits are given in MSB first order but the bit reader reads LSB first*/
    reverse = reverseBits(symbol, l);
    numpresent++;

    if(l <= FIRSTBITS) {
      /*short symbol, fully in first table, replicated num times if l < FIRSTBITS*/
      unsigned num = 1u << (FIRSTBITS - l);
      unsigned j;
      for(j = 0; j < num; ++j) {
        /*bit reader will read the l bits of symbol first, the remaining FIRSTBITS - l bits go to the MSB's*/
        unsigned index = reverse | (j << l);
        if(tree->table_len[index] != 16) return 55; /*invalid tree: long symbol shares prefix with short symbol*/
        tree->table_len[index] = l;
        tree->table_value[index] = (unsigned short)i;
      }
    } else {
      /*long symbol, shares prefix with other long symbols in first lookup table, needs second lookup*/
      /*the FIRSTBITS MSBs of the symbol are the first table index*/
      unsigned index = reverse & mask;
      unsigned maxlen = tree->table_len[index];
      /*log2 of secondary table length, should be >= l - FIRSTBITS*/
      unsigned tablelen = maxlen - FIRSTBITS;
      unsigned start = tree->table_value[index]; /*starting index in secondary table*/
      unsigned num = 1u << (tablelen - (l - FIRSTBITS)); /*amount of entries of this symbol in secondary table*/
      unsigned j;
      if(maxlen < l) return 55; /*invalid tree: long symbol shares prefix with short symbol*/
      for(j = 0; j < num; ++j) {
        unsigned reverse2 = reverse >> FIRSTBITS; /* l - FIRSTBITS bits */
        unsigned index2 = start + (reverse2 | (j << (l - FIRSTBITS)));
        tree->table_len[index2] = l;
        tree->table_value[index2] = (unsigned short)i;
      }
    }
  }

  if(numpresent < 2) {
    /* In case of exactly 1 symbol, in theory the huffman symbol needs 0 bits,
    but deflate uses 1 bit instead. In case of 0 symbols, no symbols can
    appear at all, but such huffman tree could still exist (e.g. if distance
    codes are never used). In both cases, not all symbols of the table will be
    filled in. Fill them in with an invalid symbol value so returning them from
    huffmanDecodeSymbol will cause error. */
    for(i = 0; i < size; ++i) {
      if(tree->table_len[i] == 16) {
        /* As length, use a value smaller than FIRSTBITS for the head table,
        and a value larger than FIRSTBITS for the secondary table, to ensure
        valid behavior for advanceBits when reading this symbol. */
        tree->table_len[i] = (i < headsize) ? 1 : (FIRSTBITS + 1);
        tree->table_value[i] = INVALIDSYMBOL;
      }
    }
  } else {
    /* A good huffman tree has N * 2 - 1 nodes, of which N - 1 are internal nodes.
    If that is not the case (due to too long length codes), the table will not
    have been fully used, and this is an error (not all bit combinations can be
    decoded): an oversubscribed huffman tree, indicated by error 55. */
    for(i = 0; i < size; ++i) {
      if(tree->table_len[i] == 16) return 55;
    }
  }

  return 0;
}